

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<capnp::Capability::Client,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++:170:48),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<capnp::Capability::Client,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:170:48),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  ArrayDisposer *pAVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ExceptionOr<kj::_::Void> depResult;
  Fault local_5e0;
  ArrayDisposer *local_5d8;
  size_t local_5d0;
  ExceptionOr<capnp::Capability::Client> *local_5c8;
  ExceptionOr<capnp::Capability::Client> local_5c0;
  undefined1 local_448 [40];
  char *local_420;
  _func_int **pp_Stack_418;
  ArrayDisposer *local_410;
  Disposer *local_408;
  Context *local_400;
  undefined1 local_3f8 [264];
  ExceptionOrValue local_2f0;
  char local_190;
  Exception local_188;
  
  local_2f0.exception.ptr.isSet = false;
  local_190 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_2f0);
  uVar6 = local_2f0.exception.ptr.field_1.value.context.ptr.ptr;
  uVar5 = local_2f0.exception.ptr.field_1.value.description.content.size_;
  uVar4 = local_2f0.exception.ptr.field_1.value.description.content.ptr;
  uVar3 = local_2f0.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_2f0.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_2f0.exception.ptr.field_1 + 0x50);
    local_5d0 = local_2f0.exception.ptr.field_1.value.ownFile.content.size_;
    local_448._0_8_ = local_2f0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_448._8_8_ = local_2f0.exception.ptr.field_1.value.ownFile.content.size_;
    local_5d8 = local_2f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_448._16_8_ = local_2f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2f0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_2f0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_448._24_8_ = local_2f0.exception.ptr.field_1.value.file;
    local_448._32_8_ = local_2f0.exception.ptr.field_1._32_8_;
    local_420 = local_2f0.exception.ptr.field_1.value.description.content.ptr;
    pp_Stack_418 = (_func_int **)local_2f0.exception.ptr.field_1.value.description.content.size_;
    local_410 = local_2f0.exception.ptr.field_1.value.description.content.disposer;
    local_2f0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_2f0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_408 = local_2f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_400 = local_2f0.exception.ptr.field_1.value.context.ptr.ptr;
    local_2f0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_5c8 = (ExceptionOr<capnp::Capability::Client> *)output;
    memcpy(local_3f8,__src,0x104);
    sVar2 = local_5d0;
    pAVar1 = local_5d8;
    local_188.ownFile.content.ptr = (char *)uVar3;
    local_188.ownFile.content.size_ = local_5d0;
    local_188.ownFile.content.disposer = local_5d8;
    local_448._0_8_ = (Disposer *)0x0;
    local_448._8_8_ = (AsyncIoStream *)0x0;
    local_188.file = local_2f0.exception.ptr.field_1.value.file;
    local_188.line = local_2f0.exception.ptr.field_1.value.line;
    local_188.type = local_2f0.exception.ptr.field_1.value.type;
    local_188.description.content.ptr = (char *)uVar4;
    local_188.description.content.size_ = uVar5;
    local_188.description.content.disposer =
         local_2f0.exception.ptr.field_1.value.description.content.disposer;
    local_420 = (char *)0x0;
    pp_Stack_418 = (_func_int **)0x0;
    local_188.context.ptr.disposer = local_2f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = (Context *)uVar6;
    local_400 = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_5c0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar3
    ;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = sVar2;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer = pAVar1;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_2f0.exception.ptr.field_1.value.file;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_2f0.exception.ptr.field_1._32_8_;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar4;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar5;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_2f0.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_2f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar6;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5c0.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5c0.value.ptr.isSet = false;
    Exception::~Exception(&local_188);
    ExceptionOr<capnp::Capability::Client>::operator=(local_5c8,&local_5c0);
    uVar3 = local_5c0.value.ptr.field_1.value.hook.ptr;
    if ((local_5c0.value.ptr.isSet == true) &&
       (local_5c0.value.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
      local_5c0.value.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
      (**(local_5c0.value.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                (local_5c0.value.ptr.field_1.value.hook.disposer,
                 (_func_int *)
                 ((long)&((ClientHook *)uVar3)->_vptr_ClientHook +
                 (long)((ClientHook *)uVar3)->_vptr_ClientHook[-2]));
    }
    if (local_5c0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception((Exception *)local_448);
  }
  else if (local_190 == '\x01') {
    if ((((((this->func).this)->impl).ptr)->clientContext).ptr.ptr == (ClientContext *)0x0) {
      local_5e0.exception = (Exception *)0x0;
      local_188.ownFile.content.ptr = (char *)0x0;
      local_188.ownFile.content.size_ = 0;
      Debug::Fault::init(&local_5e0,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++"
                        );
      Debug::Fault::fatal(&local_5e0);
    }
    capnp::EzRpcClient::Impl::ClientContext::getMain((ClientContext *)local_448);
    local_5c0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5c0.value.ptr.isSet = true;
    local_5c0.value.ptr.field_1.value.hook.disposer = (Disposer *)local_448._0_8_;
    local_5c0.value.ptr.field_1.value.hook.ptr = (ClientHook *)local_448._8_8_;
    local_448._8_8_ = (AsyncIoStream *)0x0;
    ExceptionOr<capnp::Capability::Client>::operator=
              ((ExceptionOr<capnp::Capability::Client> *)output,&local_5c0);
    uVar3 = local_5c0.value.ptr.field_1.value.hook.ptr;
    if ((local_5c0.value.ptr.isSet == true) &&
       (local_5c0.value.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
      local_5c0.value.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
      (**(local_5c0.value.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                (local_5c0.value.ptr.field_1.value.hook.disposer,
                 (_func_int *)
                 ((long)&((ClientHook *)uVar3)->_vptr_ClientHook +
                 (long)((ClientHook *)uVar3)->_vptr_ClientHook[-2]));
    }
    if (local_5c0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    uVar3 = local_448._8_8_;
    if ((AsyncIoStream *)local_448._8_8_ != (AsyncIoStream *)0x0) {
      local_448._8_8_ = (AsyncIoStream *)0x0;
      (***(_func_int ***)local_448._0_8_)
                (local_448._0_8_,
                 (_func_int *)
                 ((long)&((AsyncInputStream *)uVar3)->_vptr_AsyncInputStream +
                 (long)((AsyncInputStream *)uVar3)->_vptr_AsyncInputStream[-2]));
    }
  }
  if (local_2f0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2f0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }